

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view value)

{
  ulong uVar1;
  size_type pos;
  allocator<char> local_22;
  undefined1 local_21;
  undefined1 local_20 [8];
  string_view value_local;
  string *result;
  
  value_local._M_len = value._M_len;
  local_21 = 0;
  local_20 = (undefined1  [8])this;
  value_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_22);
  std::allocator<char>::~allocator(&local_22);
  uVar1 = std::__cxx11::string::find_first_of((char)__return_storage_ptr__,10);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FirstLineOf(absl::string_view value) {
  std::string result(value);

  std::string::size_type pos = result.find_first_of('\n');
  if (pos != std::string::npos) {
    result.erase(pos);
  }

  return result;
}